

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_13::NameApplier::OnDelegateExpr(NameApplier *this,TryExpr *expr)

{
  pointer pbVar1;
  pointer pcVar2;
  Var *var;
  string_view sVar3;
  string_view name;
  
  pbVar1 = (this->labels_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  var = (Var *)(pbVar1 + -1);
  (this->labels_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)var;
  pcVar2 = pbVar1[-1]._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &pbVar1[-1].field_2) {
    operator_delete(pcVar2,pbVar1[-1].field_2._M_allocated_capacity + 1);
  }
  sVar3 = FindLabelByVar(this,&expr->delegate_target);
  name._M_str = (char *)&expr->delegate_target;
  name._M_len = (size_t)sVar3._M_str;
  UseNameForVar((NameApplier *)sVar3._M_len,name,var);
  return (Result)Ok;
}

Assistant:

Result NameApplier::OnDelegateExpr(TryExpr* expr) {
  PopLabel();
  std::string_view label = FindLabelByVar(&expr->delegate_target);
  UseNameForVar(label, &expr->delegate_target);
  return Result::Ok;
}